

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_slice.cpp
# Opt level: O2

ScalarFunctionSet * duckdb::ListSliceFun::GetFunctions(void)

{
  vector<duckdb::ScalarFunction,_true> *this;
  LogicalType varargs;
  ScalarFunctionSet *in_RDI;
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  undefined4 in_stack_fffffffffffffae4;
  undefined4 in_stack_fffffffffffffaec;
  FunctionNullHandling in_stack_fffffffffffffaf8;
  bind_lambda_function_t in_stack_fffffffffffffb00;
  scalar_function_t local_4f8;
  LogicalType local_4d8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_4c0;
  LogicalType local_4a8 [4];
  ScalarFunction fun;
  ScalarFunction local_320;
  ScalarFunction local_1f8;
  BaseScalarFunction local_d0;
  
  LogicalType::LogicalType(local_4a8,ANY);
  LogicalType::LogicalType(local_4a8 + 1,ANY);
  LogicalType::LogicalType(local_4a8 + 2,ANY);
  __l._M_len = 3;
  __l._M_array = local_4a8;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_4c0,__l,(allocator_type *)&stack0xfffffffffffffb07);
  LogicalType::LogicalType(&local_4d8,ANY);
  local_4f8.super__Function_base._M_functor._8_8_ = 0;
  local_4f8.super__Function_base._M_functor._M_unused._M_object = ArraySliceFunction;
  local_4f8._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_4f8.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(local_4a8 + 3,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = local_4a8 + 3;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_fffffffffffffae4;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_fffffffffffffaec;
  ScalarFunction::ScalarFunction
            (&fun,(vector<duckdb::LogicalType,_true> *)&local_4c0,&local_4d8,&local_4f8,
             ArraySliceBind,(bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
             (init_local_state_t)0x0,varargs,CONSISTENT,in_stack_fffffffffffffaf8,
             in_stack_fffffffffffffb00);
  LogicalType::~LogicalType(local_4a8 + 3);
  ::std::_Function_base::~_Function_base(&local_4f8.super__Function_base);
  LogicalType::~LogicalType(&local_4d8);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_4c0);
  lVar1 = 0x30;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_4a8[0].id_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  fun.super_BaseScalarFunction.null_handling = SPECIAL_HANDLING;
  BaseScalarFunction::SetReturnsError(&local_d0,&fun.super_BaseScalarFunction);
  BaseScalarFunction::~BaseScalarFunction(&local_d0);
  ScalarFunctionSet::ScalarFunctionSet(in_RDI);
  ScalarFunction::ScalarFunction(&local_1f8,&fun);
  this = &(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions;
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_1f8);
  ScalarFunction::~ScalarFunction(&local_1f8);
  LogicalType::LogicalType(local_4a8,BIGINT);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::
  emplace_back<duckdb::LogicalType>
            (&fun.super_BaseScalarFunction.super_SimpleFunction.arguments.
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,local_4a8);
  LogicalType::~LogicalType(local_4a8);
  ScalarFunction::ScalarFunction(&local_320,&fun);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_320);
  ScalarFunction::~ScalarFunction(&local_320);
  ScalarFunction::~ScalarFunction(&fun);
  return in_RDI;
}

Assistant:

ScalarFunctionSet ListSliceFun::GetFunctions() {
	// the arguments and return types are actually set in the binder function
	ScalarFunction fun({LogicalType::ANY, LogicalType::ANY, LogicalType::ANY}, LogicalType::ANY, ArraySliceFunction,
	                   ArraySliceBind);
	fun.null_handling = FunctionNullHandling::SPECIAL_HANDLING;
	BaseScalarFunction::SetReturnsError(fun);
	ScalarFunctionSet set;
	set.AddFunction(fun);
	fun.arguments.push_back(LogicalType::BIGINT);
	set.AddFunction(fun);
	return set;
}